

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O1

Action __thiscall
psy::C::SyntaxDumper::visitParameterDeclaration(SyntaxDumper *this,ParameterDeclarationSyntax *node)

{
  SpecifierListSyntax *pSVar1;
  
  for (pSVar1 = node->specs_; pSVar1 != (SpecifierListSyntax *)0x0;
      pSVar1 = (pSVar1->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pSVar1->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .value);
  }
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->decltor_);
  return Skip;
}

Assistant:

virtual Action visitParameterDeclaration(const ParameterDeclarationSyntax* node) override
    {
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        nonterminal(node->declarator());
        return Action::Skip;
    }